

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>
::dx(FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>
     *this,int i)

{
  FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_> *in_RDI;
  value_type vVar1;
  value_type vVar2;
  int in_stack_ffffffffffffffdc;
  
  vVar1 = FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>
          ::dx((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)in_RDI,in_stack_ffffffffffffffdc);
  vVar2 = FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>::dx
                    (in_RDI,in_stack_ffffffffffffffdc);
  return vVar1 + vVar2;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) + right_.dx(i);}